

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::PRandM::PRandM(PRandM *this,Mat *r_nd,Mat *r_st,int k,int m)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Mat *r_st_00;
  ulong uVar3;
  Mat *r_nd_00;
  int *piVar4;
  Mat *in_RSI;
  Op *in_RDI;
  Mat *b_B;
  int in_R8D;
  int i;
  int tmp_c;
  int tmp_r;
  Mat *in_stack_ffffffffffffff80;
  int *local_68;
  PRandM *this_00;
  int local_38;
  
  Op::Op(in_RDI);
  in_RDI->_vptr_Op = (_func_int **)&PTR_forward_00154600;
  uVar2 = Mat::rows(in_RSI);
  Mat::cols(in_RSI);
  r_st_00 = (Mat *)(long)in_R8D;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = r_st_00;
  uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
  b_B = (Mat *)(uVar3 + 8);
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    b_B = (Mat *)0xffffffffffffffff;
  }
  r_nd_00 = (Mat *)operator_new__((ulong)b_B);
  *(Mat **)r_nd_00 = r_st_00;
  local_68 = &r_nd_00->order;
  this_00 = (PRandM *)local_68;
  if (r_st_00 != (Mat *)0x0) {
    piVar4 = local_68 + (long)r_st_00 * 10;
    do {
      Mat::Mat(in_stack_ffffffffffffff80);
      local_68 = local_68 + 10;
    } while (local_68 != piVar4);
  }
  *(PRandM **)&in_RDI[1].backRound = this_00;
  for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
    Mat::init((Mat *)(*(long *)&in_RDI[1].backRound + (long)local_38 * 0x28),
              (EVP_PKEY_CTX *)(ulong)uVar2);
  }
  PRandM_init(this_00,r_nd_00,r_st_00,b_B,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

MathOp::PRandM::PRandM(Mat *r_nd, Mat *r_st, int k, int m) {
    int tmp_r, tmp_c;
    tmp_r = r_nd->rows();
    tmp_c = r_nd->cols();
    b_B = new Mat[m];
    for (int i = 0; i < m; i++) {
        b_B[i].init(tmp_r, tmp_c);
    }
    PRandM_init(r_nd, r_st, b_B, k, m);
}